

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O0

void foo1(int *a)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  saver_success<int_&> SAVER_SUCCES_0;
  int *a_local;
  
  SAVER_SUCCES_0.super_state_saver<int_&,_nstd::detail::on_success_policy>._16_8_ = a;
  nstd::saver_success<int_&>::state_saver((saver_success<int_&> *)local_28,a);
  *(undefined4 *)SAVER_SUCCES_0.super_state_saver<int_&,_nstd::detail::on_success_policy>._16_8_ = 1
  ;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo1 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)SAVER_SUCCES_0.
                                     super_state_saver<int_&,_nstd::detail::on_success_policy>.
                                     _16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::saver_success<int_&>::~saver_success((saver_success<int_&> *)local_28);
  return;
}

Assistant:

void foo1(int& a) {
  SAVER_SUCCESS(a); // State saver on success.

  a = 1;
  std::cout << "foo1 a = " << a << std::endl;
 // Original state will automatically restored, on scope leave when no exceptions have been thrown.
}